

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O3

uint __thiscall
RigidBodyDynamics::ConstraintSet::AddConstraint
          (ConstraintSet *this,uint body_id,Vector3d *body_point,Vector3d *world_normal,
          char *constraint_name,double normal_acceleration)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator __position;
  iterator iVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  double dVar6;
  ulong uVar7;
  Index new_rows;
  ulong __n;
  string name_str;
  allocator_type local_8d;
  uint local_8c;
  vector<Vector3_t,_std::allocator<Vector3_t>_> local_88;
  double local_70;
  value_type local_68;
  value_type local_48;
  
  paVar1 = &local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_8c = body_id;
  local_70 = normal_acceleration;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (constraint_name != (char *)0x0) {
    strlen(constraint_name);
    std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,(ulong)constraint_name);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(this + 8),&local_68);
  __position._M_current = *(uint **)(this + 0x28);
  if (__position._M_current == *(uint **)(this + 0x30)) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)(this + 0x20),__position,
               &local_8c);
  }
  else {
    *__position._M_current = body_id;
    *(uint **)(this + 0x28) = __position._M_current + 1;
  }
  iVar2._M_current = *(Vector3_t **)(this + 0x40);
  if (iVar2._M_current == *(Vector3_t **)(this + 0x48)) {
    std::vector<Vector3_t,std::allocator<Vector3_t>>::_M_realloc_insert<Vector3_t_const&>
              ((vector<Vector3_t,std::allocator<Vector3_t>> *)(this + 0x38),iVar2,body_point);
  }
  else {
    ((iVar2._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         (body_point->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    dVar6 = (body_point->super_Vector3d).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    ((iVar2._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         (body_point->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[0];
    ((iVar2._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = dVar6;
    *(long *)(this + 0x40) = *(long *)(this + 0x40) + 0x18;
  }
  iVar2._M_current = *(Vector3_t **)(this + 0x58);
  if (iVar2._M_current == *(Vector3_t **)(this + 0x60)) {
    std::vector<Vector3_t,std::allocator<Vector3_t>>::_M_realloc_insert<Vector3_t_const&>
              ((vector<Vector3_t,std::allocator<Vector3_t>> *)(this + 0x50),iVar2,world_normal);
  }
  else {
    ((iVar2._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         (world_normal->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         .m_storage.m_data.array[2];
    dVar6 = (world_normal->super_Vector3d).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    ((iVar2._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         (world_normal->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         .m_storage.m_data.array[0];
    ((iVar2._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = dVar6;
    *(long *)(this + 0x58) = *(long *)(this + 0x58) + 0x18;
  }
  uVar7 = *(ulong *)(this + 0x70);
  uVar5 = (uint)uVar7;
  __n = (ulong)(uVar5 + 1);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x68),__n,__n,1);
  uVar7 = uVar7 & 0xffffffff;
  *(double *)(*(long *)(this + 0x68) + uVar7 * 8) = local_70;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x78),__n,__n,1);
  *(undefined8 *)(*(long *)(this + 0x78) + uVar7 * 8) = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x88),__n,__n,1);
  *(undefined8 *)(*(long *)(this + 0x88) + uVar7 * 8) = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x98),__n,__n,1);
  ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x98))->m_data[uVar7] = 0.0;
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector(&local_88,__n,&local_48,&local_8d);
  pvVar3 = *(void **)(this + 0x2e8);
  lVar4 = *(long *)(this + 0x2f8);
  *(pointer *)(this + 0x2e8) =
       local_88.super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(this + 0x2f0) =
       local_88.super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(this + 0x2f8) =
       local_88.super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_88.super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_88.super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_88.super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,lVar4 - (long)pvVar3);
    if (local_88.super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return uVar5;
}

Assistant:

unsigned int ConstraintSet::AddConstraint (
		unsigned int body_id,
		const Vector3d &body_point,
		const Vector3d &world_normal,
		const char *constraint_name,
		double normal_acceleration) {
	assert (bound == false);

	std::string name_str;
	if (constraint_name != NULL)
		name_str = constraint_name;

	name.push_back (name_str);
	body.push_back (body_id);
	point.push_back (body_point);
	normal.push_back (world_normal);

	unsigned int n_constr = acceleration.size() + 1;

	acceleration.conservativeResize (n_constr);
	acceleration[n_constr - 1] = normal_acceleration;

	force.conservativeResize (n_constr);
	force[n_constr - 1] = 0.;

	impulse.conservativeResize (n_constr);
	impulse[n_constr - 1] = 0.;

	v_plus.conservativeResize (n_constr);
	v_plus[n_constr - 1] = 0.;

	d_multdof3_u = std::vector<Math::Vector3d> (n_constr, Math::Vector3d::Zero());

	return n_constr - 1;
}